

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

GLchar * __thiscall
gl4cts::GPUShaderFP64Test3::getUniformLayoutName
          (GPUShaderFP64Test3 *this,uniformDataLayout uniform_data_layout)

{
  char *local_20;
  GLchar *layout;
  uniformDataLayout uniform_data_layout_local;
  GPUShaderFP64Test3 *this_local;
  
  local_20 = "";
  if (uniform_data_layout == PACKED) {
    local_20 = "packed";
  }
  else if (uniform_data_layout == SHARED) {
    local_20 = "shared";
  }
  else if (uniform_data_layout == STD140) {
    local_20 = "std140";
  }
  return local_20;
}

Assistant:

const glw::GLchar* GPUShaderFP64Test3::getUniformLayoutName(uniformDataLayout uniform_data_layout) const
{
	const glw::GLchar* layout = "";

	switch (uniform_data_layout)
	{
	case PACKED:
		layout = "packed";
		break;
	case SHARED:
		layout = "shared";
		break;
	case STD140:
		layout = "std140";
		break;
	}

	return layout;
}